

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::
construct_persistence_landscape_from_barcode
          (Persistence_landscape *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          size_t number_of_levels)

{
  double *pdVar1;
  long lVar2;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  __last;
  ulong uVar3;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  _Var4;
  long lVar5;
  pair<double,_double> *ppVar6;
  long lVar7;
  size_t sVar8;
  double dVar9;
  double dVar10;
  pair<double,_double> point;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  characteristicPoints;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> bars;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  Persistence_landscape;
  value_type local_e8;
  pair<double,_double> local_c8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_b0;
  pair<double,_double> local_98;
  pair<double,_double> *local_88;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_78;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  _Stack_70;
  long local_68;
  size_t local_60;
  Persistence_landscape *local_58;
  size_t local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_48;
  
  local_78._M_current = (pair<double,_double> *)0x0;
  _Stack_70._M_current = (pair<double,_double> *)0x0;
  local_68 = 0;
  local_60 = number_of_levels;
  local_58 = this;
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&local_78,
             0,(p->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (p->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  __last._M_current = _Stack_70._M_current;
  _Var4._M_current = local_78._M_current;
  if (local_78._M_current != _Stack_70._M_current) {
    uVar3 = (long)_Stack_70._M_current - (long)local_78._M_current >> 4;
    lVar5 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,double>,std::pair<double,double>)>>
              (local_78,_Stack_70,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(std::pair<double,_double>,_std::pair<double,_double>)>)
               0x1029ac);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,double>,std::pair<double,double>)>>
              (_Var4,__last,
               (_Iter_comp_iter<bool_(*)(std::pair<double,_double>,_std::pair<double,_double>)>)
               0x1029ac);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_b0,
             (long)(p->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(p->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_48);
  if ((long)_Stack_70._M_current - (long)local_78._M_current != 0) {
    lVar5 = (long)_Stack_70._M_current - (long)local_78._M_current >> 4;
    lVar7 = 0;
    do {
      pdVar1 = (double *)((long)&(local_78._M_current)->first + lVar7);
      dVar10 = *pdVar1;
      dVar9 = pdVar1[1];
      pdVar1 = (double *)
               ((long)&(local_b0.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar7);
      *pdVar1 = (dVar10 + dVar9) * 0.5;
      pdVar1[1] = (dVar9 - dVar10) * 0.5;
      lVar7 = lVar7 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  local_48.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar8 = 0;
  do {
    if (local_b0.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_b0.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    local_e8.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
    local_e8.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_double> *)0x0;
    local_98.first = -2147483647.0;
    local_98.second = 0.0;
    local_50 = sVar8;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_realloc_insert<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_e8,(iterator)0x0,&local_98);
    local_98.first =
         (local_b0.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first -
         (local_b0.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second;
    local_98.second = 0.0;
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_e8,
                 (iterator)
                 local_e8.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_98);
    }
    else {
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = local_98.first;
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_e8.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e8.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>const&>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_e8,
                 (iterator)
                 local_e8.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      dVar10 = (local_b0.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first =
           (local_b0.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first;
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = dVar10;
      local_e8.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e8.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_98.first = 0.0;
    local_98.second = 0.0;
    local_88 = (pair<double,_double> *)0x0;
    if (0x10 < (ulong)((long)local_b0.
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b0.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar3 = 1;
      do {
        lVar5 = uVar3 * 0x10;
        dVar10 = local_b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].first -
                 local_b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].second;
        if ((dVar10 < local_e8.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first -
                      local_e8.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].second) ||
           (dVar9 = local_e8.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].first +
                    local_e8.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second,
           local_b0.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar3].first +
           local_b0.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar3].second <= dVar9)) {
          ppVar6 = local_b0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3;
          if ((pair<double,_double> *)local_98.second != local_88) {
            dVar10 = ppVar6->second;
            *(double *)local_98.second = ppVar6->first;
            *(double *)((long)local_98.second + 8) = dVar10;
            lVar7 = 1;
            ppVar6 = &local_98;
            goto LAB_0010305c;
          }
          lVar7 = 1;
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>const&>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_98,(iterator)local_98.second,ppVar6);
        }
        else {
          if (dVar9 <= dVar10) {
            local_c8.second = 0.0;
            if (local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_c8.first = dVar9;
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_e8,
                         (iterator)
                         local_e8.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
            }
            else {
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = dVar9;
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
              local_e8.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e8.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_c8.first =
                 local_b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].first -
                 local_b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].second;
            local_c8.second = 0.0;
            if (local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_e8,
                         (iterator)
                         local_e8.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
            }
            else {
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_c8.first;
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
              local_e8.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e8.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar7 = 1;
          }
          else {
            local_c8.first = (dVar10 + dVar9) * 0.5;
            local_c8.second = (dVar9 - dVar10) * 0.5;
            if (local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e8.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>const&>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_e8,
                         (iterator)
                         local_e8.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
            }
            else {
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_c8.first;
              (local_e8.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_c8.second;
              local_e8.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e8.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar7 = 1;
            if (uVar3 + 1 <
                (ulong)((long)local_b0.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b0.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
              do {
                dVar10 = *(double *)
                          ((long)&local_b0.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].first + lVar5);
                dVar9 = *(double *)
                         ((long)&local_b0.
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].second + lVar5);
                if ((epsi <= ABS((local_c8.first - local_c8.second) - (dVar10 - dVar9))) ||
                   (dVar10 + dVar9 < local_c8.first + local_c8.second)) break;
                ppVar6 = (pair<double,_double> *)
                         ((long)&local_b0.
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].first + lVar5);
                if ((pair<double,_double> *)local_98.second == local_88) {
                  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                  _M_realloc_insert<std::pair<double,double>const&>
                            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                              *)&local_98,(iterator)local_98.second,ppVar6);
                }
                else {
                  dVar10 = ppVar6->second;
                  *(double *)local_98.second = ppVar6->first;
                  *(double *)((long)local_98.second + 8) = dVar10;
                  local_98.second = (double)((long)local_98.second + 0x10);
                }
                lVar2 = lVar7 + uVar3;
                lVar7 = lVar7 + 1;
                lVar5 = lVar5 + 0x10;
              } while (lVar2 + 1U <
                       (ulong)((long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            if ((pair<double,_double> *)local_98.second == local_88) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>const&>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_98,(iterator)local_98.second,&local_c8);
            }
            else {
              *(double *)local_98.second = local_c8.first;
              *(double *)((long)local_98.second + 8) = local_c8.second;
              local_98.second = (double)((long)local_98.second + 0x10);
            }
            if (lVar7 + uVar3 <
                (ulong)((long)local_b0.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b0.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
              lVar5 = (lVar7 + uVar3) * 0x10;
              do {
                dVar10 = *(double *)
                          ((long)&(local_b0.
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar5);
                dVar9 = *(double *)
                         ((long)&(local_b0.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second + lVar5);
                if ((dVar10 - dVar9 < local_c8.first - local_c8.second) ||
                   (local_c8.first + local_c8.second < dVar10 + dVar9)) break;
                ppVar6 = (pair<double,_double> *)
                         ((long)&(local_b0.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar5);
                if ((pair<double,_double> *)local_98.second == local_88) {
                  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                  _M_realloc_insert<std::pair<double,double>const&>
                            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                              *)&local_98,(iterator)local_98.second,ppVar6);
                }
                else {
                  dVar10 = ppVar6->second;
                  *(double *)local_98.second = ppVar6->first;
                  *(double *)((long)local_98.second + 8) = dVar10;
                  local_98.second = (double)((long)local_98.second + 0x10);
                }
                lVar5 = lVar5 + 0x10;
                lVar2 = lVar7 + uVar3;
                lVar7 = lVar7 + 1;
              } while (lVar2 + 1U <
                       (ulong)((long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
          }
          ppVar6 = local_b0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3;
          if (local_e8.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_e8.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>const&>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_e8,
                       (iterator)
                       local_e8.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,ppVar6);
          }
          else {
            dVar10 = ppVar6->second;
            (local_e8.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = ppVar6->first;
            (local_e8.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = dVar10;
            ppVar6 = (pair<double,_double> *)&local_e8;
LAB_0010305c:
            ppVar6->second = (double)((long)ppVar6->second + 0x10);
          }
        }
        uVar3 = uVar3 + lVar7;
      } while (uVar3 < (ulong)((long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b0.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    local_c8.first =
         local_e8.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].first +
         local_e8.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].second;
    local_c8.second = 0.0;
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_e8,
                 (iterator)
                 local_e8.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
    }
    else {
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = local_c8.first;
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_e8.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e8.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_c8.first = 2147483647.0;
    local_c8.second = 0.0;
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_e8,
                 (iterator)
                 local_e8.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
    }
    else {
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = 2147483647.0;
      (local_e8.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_e8.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e8.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              (&local_b0,
               (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_98);
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_e8.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_e8.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != _Var4._M_current) {
      local_e8.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)_Var4;
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::push_back(&local_58->land,&local_e8);
    if ((void *)local_98.first != (void *)0x0) {
      operator_delete((void *)local_98.first,(long)local_88 - (long)local_98.first);
    }
    sVar8 = local_50;
    if (local_e8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    sVar8 = sVar8 + 1;
  } while (sVar8 != local_60);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_48);
  if (local_b0.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<double,_double> *)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78._M_current != (pair<double,_double> *)0x0) {
    operator_delete(local_78._M_current,local_68 - (long)local_78._M_current);
  }
  return;
}

Assistant:

void Persistence_landscape::construct_persistence_landscape_from_barcode(
    const std::vector<std::pair<double, double> >& p, size_t number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Persistence_landscape::Persistence_landscape( const std::vector< std::pair< double , double > >& p )"
              << std::endl;
  }

  // this is a general algorithm to construct persistence landscapes.
  std::vector<std::pair<double, double> > bars;
  bars.insert(bars.begin(), p.begin(), p.end());
  std::sort(bars.begin(), bars.end(), compare_points_sorting);

  if (dbg) {
    std::clog << "Bars : \n";
    for (size_t i = 0; i != bars.size(); ++i) {
      std::clog << bars[i].first << " " << bars[i].second << "\n";
    }
    getchar();
  }

  std::vector<std::pair<double, double> > characteristicPoints(p.size());
  for (size_t i = 0; i != bars.size(); ++i) {
    characteristicPoints[i] =
        std::make_pair((bars[i].first + bars[i].second) / 2.0, (bars[i].second - bars[i].first) / 2.0);
  }
  std::vector<std::vector<std::pair<double, double> > > Persistence_landscape;
  size_t number_of_levels_in_the_landscape = 0;
  while (!characteristicPoints.empty()) {
    if (dbg) {
      for (size_t i = 0; i != characteristicPoints.size(); ++i) {
        std::clog << "(" << characteristicPoints[i].first << " " << characteristicPoints[i].second << ")\n";
      }
      std::cin.ignore();
    }

    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    lambda_n.push_back(std::make_pair(minus_length(characteristicPoints[0]), 0));
    lambda_n.push_back(characteristicPoints[0]);

    if (dbg) {
      std::clog << "1 Adding to lambda_n : (" << -std::numeric_limits<int>::max() << " " << 0 << ") , ("
                << minus_length(characteristicPoints[0]) << " " << 0 << ") , (" << characteristicPoints[0].first << " "
                << characteristicPoints[0].second << ") \n";
    }

    size_t i = 1;
    std::vector<std::pair<double, double> > newCharacteristicPoints;
    while (i < characteristicPoints.size()) {
      size_t p = 1;
      if ((minus_length(characteristicPoints[i]) >= minus_length(lambda_n[lambda_n.size() - 1])) &&
          (birth_plus_deaths(characteristicPoints[i]) > birth_plus_deaths(lambda_n[lambda_n.size() - 1]))) {
        if (minus_length(characteristicPoints[i]) < birth_plus_deaths(lambda_n[lambda_n.size() - 1])) {
          std::pair<double, double> point = std::make_pair(
              (minus_length(characteristicPoints[i]) + birth_plus_deaths(lambda_n[lambda_n.size() - 1])) / 2,
              (birth_plus_deaths(lambda_n[lambda_n.size() - 1]) - minus_length(characteristicPoints[i])) / 2);
          lambda_n.push_back(point);
          if (dbg) {
            std::clog << "2 Adding to lambda_n : (" << point.first << " " << point.second << ")\n";
          }

          if (dbg) {
            std::clog << "characteristicPoints[i+p] : " << characteristicPoints[i + p].first << " "
                      << characteristicPoints[i + p].second << "\n";
            std::clog << "point : " << point.first << " " << point.second << "\n";
            getchar();
          }

          while ((i + p < characteristicPoints.size()) &&
                 (almost_equal(minus_length(point), minus_length(characteristicPoints[i + p]))) &&
                 (birth_plus_deaths(point) <= birth_plus_deaths(characteristicPoints[i + p]))) {
            newCharacteristicPoints.push_back(characteristicPoints[i + p]);
            if (dbg) {
              std::clog << "3.5 Adding to newCharacteristicPoints : (" << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << ")\n";
              getchar();
            }
            ++p;
          }

          newCharacteristicPoints.push_back(point);
          if (dbg) {
            std::clog << "4 Adding to newCharacteristicPoints : (" << point.first << " " << point.second << ")\n";
          }

          while ((i + p < characteristicPoints.size()) &&
                 (minus_length(point) <= minus_length(characteristicPoints[i + p])) &&
                 (birth_plus_deaths(point) >= birth_plus_deaths(characteristicPoints[i + p]))) {
            newCharacteristicPoints.push_back(characteristicPoints[i + p]);
            if (dbg) {
              std::clog << "characteristicPoints[i+p] : " << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << "\n";
              std::clog << "point : " << point.first << " " << point.second << "\n";
              std::clog << "characteristicPoints[i+p] birth and death : " << minus_length(characteristicPoints[i + p])
                        << " , " << birth_plus_deaths(characteristicPoints[i + p]) << "\n";
              std::clog << "point birth and death : " << minus_length(point) << " , " << birth_plus_deaths(point)
                        << "\n";

              std::clog << "3 Adding to newCharacteristicPoints : (" << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << ")\n";
              getchar();
            }
            ++p;
          }

        } else {
          lambda_n.push_back(std::make_pair(birth_plus_deaths(lambda_n[lambda_n.size() - 1]), 0));
          lambda_n.push_back(std::make_pair(minus_length(characteristicPoints[i]), 0));
          if (dbg) {
            std::clog << "5 Adding to lambda_n : (" << birth_plus_deaths(lambda_n[lambda_n.size() - 1]) << " " << 0
                      << ")\n";
            std::clog << "5 Adding to lambda_n : (" << minus_length(characteristicPoints[i]) << " " << 0 << ")\n";
          }
        }
        lambda_n.push_back(characteristicPoints[i]);
        if (dbg) {
          std::clog << "6 Adding to lambda_n : (" << characteristicPoints[i].first << " "
                    << characteristicPoints[i].second << ")\n";
        }
      } else {
        newCharacteristicPoints.push_back(characteristicPoints[i]);
        if (dbg) {
          std::clog << "7 Adding to newCharacteristicPoints : (" << characteristicPoints[i].first << " "
                    << characteristicPoints[i].second << ")\n";
        }
      }
      i = i + p;
    }
    lambda_n.push_back(std::make_pair(birth_plus_deaths(lambda_n[lambda_n.size() - 1]), 0));
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));

    characteristicPoints = newCharacteristicPoints;

    lambda_n.erase(std::unique(lambda_n.begin(), lambda_n.end()), lambda_n.end());
    this->land.push_back(lambda_n);

    ++number_of_levels_in_the_landscape;
    if (number_of_levels == number_of_levels_in_the_landscape) {
      break;
    }
  }
}